

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O2

void __thiscall QNetworkReplyImplPrivate::_q_copyReadyRead(QNetworkReplyImplPrivate *this)

{
  undefined1 *this_00;
  QNetworkReply *this_01;
  QIODevice *pQVar1;
  qint64 _t1;
  char cVar2;
  long bytes;
  long lVar3;
  char *pcVar4;
  long lVar5;
  longlong _t2;
  long in_FS_OFFSET;
  QByteArrayView QVar6;
  optional<long_long> oVar7;
  QByteArrayView value;
  int local_50 [2];
  _Storage<long_long,_true> local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->state == Working) && (this->copyDevice != (QIODevice *)0x0)) {
    this_01 = *(QNetworkReply **)&(this->super_QNetworkReplyPrivate).field_0x8;
    cVar2 = QIODevice::isOpen();
    if (cVar2 != '\0') {
      lVar5 = this->bytesDownloaded;
      this_00 = &(this->super_QNetworkReplyPrivate).field_0x90;
      lVar3 = lVar5;
      while( true ) {
        bytes = nextDownstreamBlockSize(this);
        if (bytes == 0) break;
        lVar3 = (**(code **)(*(long *)this->copyDevice + 0xa0))();
        if (lVar3 < bytes) {
          bytes = lVar3;
        }
        if (bytes < 2) {
          bytes = 1;
        }
        pQVar1 = this->copyDevice;
        pcVar4 = QIODevicePrivate::QRingBufferRef::reserve((QRingBufferRef *)this_00,bytes);
        lVar3 = QIODevice::read((char *)pQVar1,(longlong)pcVar4);
        if (lVar3 == -1) {
          QIODevicePrivate::QRingBufferRef::chop((QRingBufferRef *)this_00,bytes);
          lVar3 = this->bytesDownloaded;
          break;
        }
        QIODevicePrivate::QRingBufferRef::chop((QRingBufferRef *)this_00,bytes - lVar3);
        cVar2 = (**(code **)(*(long *)this->copyDevice + 0x60))();
        if (cVar2 == '\0') {
          cVar2 = (**(code **)(*(long *)this->copyDevice + 0x90))();
          if (cVar2 != '\0') {
            lVar3 = this->bytesDownloaded + lVar3;
            this->bytesDownloaded = lVar3;
            break;
          }
        }
        lVar3 = this->bytesDownloaded + lVar3;
        this->bytesDownloaded = lVar3;
      }
      if (lVar3 != lVar5) {
        local_48._M_value = (longlong)&DAT_aaaaaaaaaaaaaaaa;
        puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
        QNetworkHeadersPrivate::headers((QNetworkHeadersPrivate *)local_50);
        QVar6 = QHttpHeaders::value((QHttpHeaders *)local_50,ContentLength,
                                    (QByteArrayView)ZEXT816(0));
        value.m_data = QVar6.m_data;
        value.m_size = (qsizetype)value.m_data;
        oVar7 = QNetworkHeadersPrivate::toInt((QNetworkHeadersPrivate *)QVar6.m_size,value);
        local_48._M_value =
             oVar7.super__Optional_base<long_long,_true,_true>._M_payload.
             super__Optional_payload_base<long_long>._M_payload;
        puStack_40 = (undefined1 *)
                     CONCAT71(puStack_40._1_7_,
                              oVar7.super__Optional_base<long_long,_true,_true>._M_payload.
                              super__Optional_payload_base<long_long>._M_engaged);
        QHttpHeaders::~QHttpHeaders((QHttpHeaders *)local_50);
        this->notificationHandlingPaused = true;
        QIODevice::readyRead();
        cVar2 = QElapsedTimer::isValid();
        if (cVar2 != '\0') {
          lVar5 = QElapsedTimer::elapsed();
          if (99 < lVar5) {
            QElapsedTimer::start();
            _t1 = this->bytesDownloaded;
            local_50[0] = -1;
            _t2 = std::optional<long_long>::value_or<int>((optional<long_long> *)&local_48,local_50)
            ;
            QNetworkReply::downloadProgress(this_01,_t1,_t2);
          }
        }
        resumeNotificationHandling(this);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkReplyImplPrivate::_q_copyReadyRead()
{
    Q_Q(QNetworkReplyImpl);
    if (state != Working)
        return;
    if (!copyDevice || !q->isOpen())
        return;

    // FIXME Optimize to use download buffer if it is a QBuffer.
    // Needs to be done where sendCacheContents() (?) of HTTP is emitting
    // metaDataChanged ?
    qint64 lastBytesDownloaded = bytesDownloaded;
    forever {
        qint64 bytesToRead = nextDownstreamBlockSize();
        if (bytesToRead == 0)
            // we'll be called again, eventually
            break;

        bytesToRead = qBound<qint64>(1, bytesToRead, copyDevice->bytesAvailable());
        qint64 bytesActuallyRead = copyDevice->read(buffer.reserve(bytesToRead), bytesToRead);
        if (bytesActuallyRead == -1) {
            buffer.chop(bytesToRead);
            break;
        }
        buffer.chop(bytesToRead - bytesActuallyRead);

        if (!copyDevice->isSequential() && copyDevice->atEnd()) {
            bytesDownloaded += bytesActuallyRead;
            break;
        }

        bytesDownloaded += bytesActuallyRead;
    }